

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file.cpp
# Opt level: O0

void sf2cute::SoundFont::RepairInstrumentReference
               (SFInstrument *instrument,
               unordered_map<std::shared_ptr<sf2cute::SFSample>,_std::shared_ptr<sf2cute::SFSample>,_std::hash<std::shared_ptr<sf2cute::SFSample>_>,_std::equal_to<std::shared_ptr<sf2cute::SFSample>_>,_std::allocator<std::pair<const_std::shared_ptr<sf2cute::SFSample>,_std::shared_ptr<sf2cute::SFSample>_>_>_>
               *sample_map)

{
  bool bVar1;
  SFInstrumentZone *instrument_zone_00;
  vector<std::unique_ptr<sf2cute::SFInstrumentZone,_std::default_delete<sf2cute::SFInstrumentZone>_>,_std::allocator<std::unique_ptr<sf2cute::SFInstrumentZone,_std::default_delete<sf2cute::SFInstrumentZone>_>_>_>
  *this;
  reference this_00;
  type instrument_zone_01;
  unique_ptr<sf2cute::SFInstrumentZone,_std::default_delete<sf2cute::SFInstrumentZone>_>
  *instrument_zone;
  const_iterator __end1;
  const_iterator __begin1;
  vector<std::unique_ptr<sf2cute::SFInstrumentZone,_std::default_delete<sf2cute::SFInstrumentZone>_>,_std::allocator<std::unique_ptr<sf2cute::SFInstrumentZone,_std::default_delete<sf2cute::SFInstrumentZone>_>_>_>
  *__range1;
  unordered_map<std::shared_ptr<sf2cute::SFSample>,_std::shared_ptr<sf2cute::SFSample>,_std::hash<std::shared_ptr<sf2cute::SFSample>_>,_std::equal_to<std::shared_ptr<sf2cute::SFSample>_>,_std::allocator<std::pair<const_std::shared_ptr<sf2cute::SFSample>,_std::shared_ptr<sf2cute::SFSample>_>_>_>
  *sample_map_local;
  SFInstrument *instrument_local;
  
  bVar1 = SFInstrument::has_global_zone(instrument);
  if (bVar1) {
    instrument_zone_00 = SFInstrument::global_zone(instrument);
    RepairInstrumentZoneReference(instrument_zone_00,sample_map);
  }
  this = SFInstrument::zones(instrument);
  __end1 = std::
           vector<std::unique_ptr<sf2cute::SFInstrumentZone,_std::default_delete<sf2cute::SFInstrumentZone>_>,_std::allocator<std::unique_ptr<sf2cute::SFInstrumentZone,_std::default_delete<sf2cute::SFInstrumentZone>_>_>_>
           ::begin(this);
  instrument_zone =
       (unique_ptr<sf2cute::SFInstrumentZone,_std::default_delete<sf2cute::SFInstrumentZone>_> *)
       std::
       vector<std::unique_ptr<sf2cute::SFInstrumentZone,_std::default_delete<sf2cute::SFInstrumentZone>_>,_std::allocator<std::unique_ptr<sf2cute::SFInstrumentZone,_std::default_delete<sf2cute::SFInstrumentZone>_>_>_>
       ::end(this);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<const_std::unique_ptr<sf2cute::SFInstrumentZone,_std::default_delete<sf2cute::SFInstrumentZone>_>_*,_std::vector<std::unique_ptr<sf2cute::SFInstrumentZone,_std::default_delete<sf2cute::SFInstrumentZone>_>,_std::allocator<std::unique_ptr<sf2cute::SFInstrumentZone,_std::default_delete<sf2cute::SFInstrumentZone>_>_>_>_>
                                     *)&instrument_zone), bVar1) {
    this_00 = __gnu_cxx::
              __normal_iterator<const_std::unique_ptr<sf2cute::SFInstrumentZone,_std::default_delete<sf2cute::SFInstrumentZone>_>_*,_std::vector<std::unique_ptr<sf2cute::SFInstrumentZone,_std::default_delete<sf2cute::SFInstrumentZone>_>,_std::allocator<std::unique_ptr<sf2cute::SFInstrumentZone,_std::default_delete<sf2cute::SFInstrumentZone>_>_>_>_>
              ::operator*(&__end1);
    instrument_zone_01 =
         std::unique_ptr<sf2cute::SFInstrumentZone,_std::default_delete<sf2cute::SFInstrumentZone>_>
         ::operator*(this_00);
    RepairInstrumentZoneReference(instrument_zone_01,sample_map);
    __gnu_cxx::
    __normal_iterator<const_std::unique_ptr<sf2cute::SFInstrumentZone,_std::default_delete<sf2cute::SFInstrumentZone>_>_*,_std::vector<std::unique_ptr<sf2cute::SFInstrumentZone,_std::default_delete<sf2cute::SFInstrumentZone>_>,_std::allocator<std::unique_ptr<sf2cute::SFInstrumentZone,_std::default_delete<sf2cute::SFInstrumentZone>_>_>_>_>
    ::operator++(&__end1);
  }
  return;
}

Assistant:

void SoundFont::RepairInstrumentReference(
    SFInstrument & instrument,
    const std::unordered_map<std::shared_ptr<SFSample>,
    std::shared_ptr<SFSample>> & sample_map) {
  // Repair global zone.
  if (instrument.has_global_zone()) {
    RepairInstrumentZoneReference(instrument.global_zone(), sample_map);
  }

  // Repair instrument zones.
  for (const auto & instrument_zone : instrument.zones()) {
    RepairInstrumentZoneReference(*instrument_zone, sample_map);
  }
}